

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O2

void __thiscall ipx::ForrestTomlin::ComputeSpike(ForrestTomlin *this,Int nb,Int *bi,double *bx)

{
  Vector *this_00;
  double dVar1;
  pointer piVar2;
  double *pdVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  Int p;
  long lVar8;
  double dVar9;
  double local_38;
  
  uVar6 = (ulong)((long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  local_38 = 0.0;
  this_00 = &this->work_;
  std::valarray<double>::operator=(this_00,&local_38);
  piVar2 = (this->rowperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->work_)._M_data;
  uVar4 = 0;
  uVar7 = (ulong)(uint)nb;
  if (nb < 1) {
    uVar7 = uVar4;
  }
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    pdVar3[piVar2[bi[uVar4]]] = bx[uVar4];
  }
  TriangularSolve(&this->L_,this_00,'n',"lower",1);
  uVar7 = 0;
  iVar5 = (int)uVar6;
  uVar4 = 0;
  if (0 < iVar5) {
    uVar4 = uVar6 & 0xffffffff;
  }
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    dVar1 = (this->work_)._M_data
            [(this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7]];
    dVar9 = DotColumn(&this->R_,(Int)uVar7,this_00);
    pdVar3 = (this->work_)._M_data;
    pdVar3[(long)this->dim_ + uVar7] = dVar1 - dVar9;
    pdVar3[(this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7]] = 0.0;
  }
  SparseMatrix::clear_queue(&this->U_);
  for (lVar8 = 0; lVar8 < (long)this->dim_ + (long)iVar5; lVar8 = lVar8 + 1) {
    dVar1 = (this->work_)._M_data[lVar8];
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      SparseMatrix::push_back(&this->U_,(Int)lVar8,dVar1);
    }
  }
  this->have_ftran_ = true;
  return;
}

Assistant:

void ForrestTomlin::ComputeSpike(Int nb, const Int* bi, const double* bx) {
    Int num_updates = replaced_.size();

    // Solve L*lhs=b.
    work_ = 0.0;
    for (Int p = 0; p < nb; p++)
        work_[rowperm_inv_[bi[p]]] = bx[p];
    TriangularSolve(L_, work_, 'n', "lower", 1);

    // Apply update etas.
    for (Int k = 0; k < num_updates; k++) {
        work_[dim_+k] = work_[replaced_[k]] - DotColumn(R_, k, work_);
        work_[replaced_[k]] = 0.0;
    }

    // Store spike in U. Indices are sorted, which is required for the sparse
    // dot product in Update().
    U_.clear_queue();
    for (Int p = 0; p < dim_+num_updates; p++) {
        if (work_[p] != 0.0)
            U_.push_back(p, work_[p]);
    }
    have_ftran_ = true;
}